

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O0

int __thiscall Itemset::compare(Itemset *this,Itemset *ar2)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  uint local_28;
  int local_24;
  int i;
  int len;
  Itemset *ar2_local;
  Itemset *this_local;
  
  iVar1 = size(this);
  iVar2 = size(ar2);
  if (iVar2 < iVar1) {
    local_24 = size(ar2);
  }
  else {
    local_24 = size(this);
  }
  local_28 = 0;
  while( true ) {
    if (local_24 <= (int)local_28) {
      iVar1 = size(this);
      iVar2 = size(ar2);
      if (iVar1 < iVar2) {
        this_local._4_4_ = -1;
      }
      else {
        iVar1 = size(this);
        iVar2 = size(ar2);
        if (iVar2 < iVar1) {
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      return this_local._4_4_;
    }
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                       );
    iVar1 = Array::operator[](peVar3,local_28);
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ar2)
    ;
    iVar2 = Array::operator[](peVar3,local_28);
    if (iVar2 < iVar1) break;
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                       );
    iVar1 = Array::operator[](peVar3,local_28);
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ar2)
    ;
    iVar2 = Array::operator[](peVar3,local_28);
    if (iVar1 < iVar2) {
      return -1;
    }
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

int Itemset::compare(Itemset &ar2) {
    int len;
    if (size() <= ar2.size()) len = size();
    else len = ar2.size();
    for (int i = 0; i < len; i++) {
        if ((*theItemset)[i] > (*ar2.theItemset)[i]) return 1;
        else if ((*theItemset)[i] < (*ar2.theItemset)[i]) return -1;
    }
    if (size() < ar2.size()) return -1;
    else if (size() > ar2.size()) return 1;
    else return 0;
}